

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O0

void * cipher_dupctx(void *vsrc)

{
  GOST_CTX *pGVar1;
  GOST_cipher *in_RDI;
  GOST_CTX *dst;
  GOST_CTX *src;
  
  pGVar1 = cipher_newctx(dst,in_RDI,(OSSL_PARAM *)in_RDI);
  if (pGVar1 != (GOST_CTX *)0x0) {
    EVP_CIPHER_CTX_copy((EVP_CIPHER_CTX *)pGVar1->cctx,*(EVP_CIPHER_CTX **)&in_RDI->iv_len);
  }
  return pGVar1;
}

Assistant:

static void *cipher_dupctx(void *vsrc)
{
    GOST_CTX *src = vsrc;
    GOST_CTX *dst =
        cipher_newctx(src->provctx, src->descriptor, src->known_params);

    if (dst != NULL)
        EVP_CIPHER_CTX_copy(dst->cctx, src->cctx);
    return dst;
}